

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# File.cpp
# Opt level: O0

string * __thiscall
higan::FileForRead::ReadLine_abi_cxx11_(string *__return_storage_ptr__,FileForRead *this)

{
  ssize_t sVar1;
  allocator<char> local_19;
  FileForRead *local_18;
  FileForRead *this_local;
  
  local_18 = this;
  this_local = (FileForRead *)__return_storage_ptr__;
  sVar1 = ReadFileToBuffer(this,&this->cache_buffer_);
  if (sVar1 == -1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",&local_19);
    std::allocator<char>::~allocator(&local_19);
  }
  else {
    Buffer::ReadLine_abi_cxx11_(__return_storage_ptr__,&this->cache_buffer_);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string FileForRead::ReadLine()
{
	if (ReadFileToBuffer(&cache_buffer_) == -1)
	{
		return "";
	}

	return cache_buffer_.ReadLine();
}